

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O3

unique_ptr<Entry<ON_SimpleArray<int>_>,_std::default_delete<Entry<ON_SimpleArray<int>_>_>_>
make_entry<ON_SimpleArray<int>>(ON_SimpleArray<int> *value)

{
  _func_int **pp_Var1;
  ON_SimpleArray<int> *in_RSI;
  
  pp_Var1 = (_func_int **)operator_new(0x20);
  *pp_Var1 = (_func_int *)&PTR__DictionaryEntryT_0080a048;
  pp_Var1[1] = (_func_int *)&PTR__ON_SimpleArray_00808cb8;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  ON_SimpleArray<int>::operator=((ON_SimpleArray<int> *)(pp_Var1 + 1),in_RSI);
  *pp_Var1 = (_func_int *)&PTR__DictionaryEntryT_00809fd8;
  value->_vptr_ON_SimpleArray = pp_Var1;
  return (__uniq_ptr_data<Entry<ON_SimpleArray<int>_>,_std::default_delete<Entry<ON_SimpleArray<int>_>_>,_true,_true>
          )(_Tuple_impl<0UL,_Entry<ON_SimpleArray<int>_>_*,_std::default_delete<Entry<ON_SimpleArray<int>_>_>_>
            )0x809fd8;
}

Assistant:

static std::unique_ptr<Entry<T>> make_entry(const T& value)
{
  return std::make_unique<Entry<T>>(value);
}